

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

RequiredError *
CLI::RequiredError::Subcommand(RequiredError *__return_storage_ptr__,size_t min_subcom)

{
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  allocator local_39;
  string local_38;
  size_t local_18;
  size_t min_subcom_local;
  
  local_18 = min_subcom;
  min_subcom_local = (size_t)__return_storage_ptr__;
  if (min_subcom == 1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_38,"A subcommand",&local_39);
    RequiredError(__return_storage_ptr__,&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    std::__cxx11::to_string(&local_b0,min_subcom);
    ::std::operator+(&local_90,"Requires at least ",&local_b0);
    ::std::operator+(&local_70,&local_90," subcommands");
    RequiredError(__return_storage_ptr__,&local_70,RequiredError);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_90);
    ::std::__cxx11::string::~string((string *)&local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

static RequiredError Subcommand(size_t min_subcom) {
        if(min_subcom == 1)
            return RequiredError("A subcommand");
        else
            return RequiredError("Requires at least " + std::to_string(min_subcom) + " subcommands",
                                 ExitCodes::RequiredError);
    }